

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O1

int Amap_LibCreateMux(Amap_Lib_t *p,int iFan0,int iFan1,int iFan2)

{
  uint uVar1;
  Amap_Nod_t *pAVar2;
  Amap_Nod_t *pAVar3;
  
  pAVar3 = Amap_LibCreateObj(p);
  uVar1 = *(uint *)pAVar3;
  *(uint *)pAVar3 = uVar1 & 0xffffff | 0x6000000;
  if (((-1 < iFan0) && (-1 < iFan1)) && (-1 < iFan2)) {
    pAVar2 = p->pNodes;
    *(uint *)pAVar3 =
         uVar1 & 0xffff | 0x6000000 |
         ((uint)(byte)pAVar2[(uint)iFan0 >> 1].field_0x2 * 0x10000 +
          *(int *)(pAVar2 + ((uint)iFan1 >> 1)) & 0xff0000) + *(int *)(pAVar2 + ((uint)iFan2 >> 1))
         & 0xff0000;
    pAVar3->iFan0 = (short)iFan0;
    pAVar3->iFan1 = (short)iFan1;
    pAVar3->iFan2 = (short)iFan2;
    if (p->fVerbose != 0) {
      printf("Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c  iFan2 = %5d%c\n",
             (ulong)(uVar1 & 0xffff),0x6d,(ulong)((uint)iFan0 >> 1),(ulong)((iFan0 & 1U) * 2 + 0x2b)
             ,(ulong)((uint)iFan1 >> 1),(ulong)((iFan1 & 1U) * 2 + 0x2b),(ulong)((uint)iFan2 >> 1),
             (ulong)((iFan2 & 1U) * 2 + 0x2b));
    }
    Vec_IntPush(p->vRules3,iFan0);
    Vec_IntPush(p->vRules3,iFan1);
    Vec_IntPush(p->vRules3,iFan2);
    Vec_IntPush(p->vRules3,(uint)*(ushort *)pAVar3);
    return (int)*(ushort *)pAVar3;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Amap_LibCreateMux( Amap_Lib_t * p, int iFan0, int iFan1, int iFan2 )
{
    Amap_Nod_t * pNode;
    pNode = Amap_LibCreateObj( p );
    pNode->Type  = AMAP_OBJ_MUX;
    pNode->nSuppSize = p->pNodes[Abc_Lit2Var(iFan0)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan1)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan2)].nSuppSize;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
    pNode->iFan2 = iFan2;
if ( p->fVerbose )
printf( "Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c  iFan2 = %5d%c\n", 
pNode->Id, 'm', 
Abc_Lit2Var(iFan0), (Abc_LitIsCompl(iFan0)?'-':'+'), 
Abc_Lit2Var(iFan1), (Abc_LitIsCompl(iFan1)?'-':'+'), 
Abc_Lit2Var(iFan2), (Abc_LitIsCompl(iFan2)?'-':'+') );

    Vec_IntPush( p->vRules3, iFan0 );
    Vec_IntPush( p->vRules3, iFan1 );
    Vec_IntPush( p->vRules3, iFan2 );
    Vec_IntPush( p->vRules3, pNode->Id );
    return pNode->Id;
}